

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall cmMakefileTargetGenerator::WriteTargetDependRules(cmMakefileTargetGenerator *this)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  byte bVar1;
  bool bVar2;
  cmGeneratedFileStream *this_01;
  char *pcVar3;
  ostream *poVar4;
  pointer ppVar5;
  reference pbVar6;
  value_type local_4a0;
  string local_480;
  allocator local_459;
  string local_458;
  string local_438;
  allocator local_411;
  string local_410;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  string local_3a8;
  allocator local_381;
  string local_380;
  string local_360;
  string local_340 [39];
  allocator local_319;
  string local_318;
  string local_2f8;
  undefined1 local_2d8 [8];
  ostringstream depCmd;
  undefined1 local_160 [8];
  string depTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string local_a8;
  iterator local_88;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  iterator local_78;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  const_iterator pi;
  string local_60;
  string local_30 [8];
  string dir;
  cmMakefileTargetGenerator *this_local;
  
  dir.field_2._8_8_ = this;
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xb])
            (local_30,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::__cxx11::string::operator=((string *)&this->InfoFileNameFull,local_30);
  std::__cxx11::string::operator+=((string *)&this->InfoFileNameFull,"/DependInfo.cmake");
  cmLocalUnixMakefileGenerator3::ConvertToFullPath
            (&local_60,this->LocalGenerator,&this->InfoFileNameFull);
  std::__cxx11::string::operator=((string *)&this->InfoFileNameFull,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  this_01 = (cmGeneratedFileStream *)operator_new(0x248);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream(this_01,pcVar3,false);
  this->InfoFileStream = this_01;
  cmGeneratedFileStream::SetCopyIfDifferent(this->InfoFileStream,true);
  bVar1 = std::ios::operator!((ios *)((long)&(this->InfoFileStream->super_ofstream).
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream +
                                     (long)(this->InfoFileStream->super_ofstream).
                                           super_basic_ostream<char,_std::char_traits<char>_>.
                                           _vptr_basic_ostream[-3]));
  if ((bVar1 & 1) == 0) {
    cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
              (this->LocalGenerator,(ostream *)this->InfoFileStream,
               (this->super_cmCommonTargetGenerator).GeneratorTarget);
    bVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(&this->MultipleOutputPairs);
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)this->InfoFileStream,"\n");
      poVar4 = std::operator<<(poVar4,"# Pairs of files generated by the same build rule.\n");
      std::operator<<(poVar4,"set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n");
      local_78._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->MultipleOutputPairs);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_const_iterator(&local_70,&local_78);
      while( true ) {
        local_88._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(&this->MultipleOutputPairs);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_Rb_tree_const_iterator(&local_80,&local_88);
        bVar2 = std::operator!=(&local_70,&local_80);
        if (!bVar2) break;
        poVar4 = std::operator<<((ostream *)this->InfoFileStream,"  ");
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_70);
        cmOutputConverter::EscapeForCMake(&local_a8,&ppVar5->first);
        poVar4 = std::operator<<(poVar4,(string *)&local_a8);
        poVar4 = std::operator<<(poVar4," ");
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_70);
        cmOutputConverter::EscapeForCMake
                  ((string *)
                   &dirs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&ppVar5->second);
        poVar4 = std::operator<<(poVar4,(string *)
                                        &dirs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator<<(poVar4,"\n");
        std::__cxx11::string::~string
                  ((string *)
                   &dirs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)&local_a8);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&local_70);
      }
      std::operator<<((ostream *)this->InfoFileStream,"  )\n\n");
    }
    poVar4 = std::operator<<((ostream *)this->InfoFileStream,"\n");
    poVar4 = std::operator<<(poVar4,"# Targets to which this target links.\n");
    std::operator<<(poVar4,"set(CMAKE_TARGET_LINKED_INFO_FILES\n");
    cmCommonTargetGenerator::GetLinkedTargetDirectories_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i,&this->super_cmCommonTargetGenerator);
    local_e8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
    while( true ) {
      local_f0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
      bVar2 = __gnu_cxx::operator!=(&local_e8,&local_f0);
      if (!bVar2) break;
      poVar4 = std::operator<<((ostream *)this->InfoFileStream,"  \"");
      pbVar6 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_e8);
      poVar4 = std::operator<<(poVar4,(string *)pbVar6);
      std::operator<<(poVar4,"/DependInfo.cmake\"\n");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_e8);
    }
    std::operator<<((ostream *)this->InfoFileStream,"  )\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
    poVar4 = std::operator<<((ostream *)this->InfoFileStream,"\n");
    poVar4 = std::operator<<(poVar4,"# Fortran module output directory.\n");
    poVar4 = std::operator<<(poVar4,"set(CMAKE_Fortran_TARGET_MODULE_DIR \"");
    cmCommonTargetGenerator::GetFortranModuleDirectory_abi_cxx11_
              ((string *)
               &depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               &this->super_cmCommonTargetGenerator);
    poVar4 = std::operator<<(poVar4,(string *)
                                    &depends.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar4,"\")\n");
    std::__cxx11::string::~string
              ((string *)
               &depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&depTarget.field_2 + 8));
    cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
              ((string *)local_160,this->LocalGenerator,
               (this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::__cxx11::string::operator+=((string *)local_160,"/depend");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
    poVar4 = std::operator<<((ostream *)local_2d8,"cd ");
    this_00 = this->LocalGenerator;
    pcVar3 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_318,pcVar3,&local_319);
    cmOutputConverter::Convert
              (&local_2f8,
               &(this_00->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_318,FULL,SHELL);
    poVar4 = std::operator<<(poVar4,(string *)&local_2f8);
    std::operator<<(poVar4," && ");
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    poVar4 = std::operator<<((ostream *)local_2d8,"$(CMAKE_COMMAND) -E cmake_depends \"");
    (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
      _vptr_cmGlobalGenerator[3])(local_340);
    poVar4 = std::operator<<(poVar4,local_340);
    poVar4 = std::operator<<(poVar4,"\" ");
    pcVar3 = cmLocalGenerator::GetSourceDirectory((cmLocalGenerator *)this->LocalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_380,pcVar3,&local_381);
    cmCommonTargetGenerator::Convert
              (&local_360,&this->super_cmCommonTargetGenerator,&local_380,FULL,SHELL);
    poVar4 = std::operator<<(poVar4,(string *)&local_360);
    poVar4 = std::operator<<(poVar4," ");
    pcVar3 = cmLocalGenerator::GetCurrentSourceDirectory((cmLocalGenerator *)this->LocalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3c8,pcVar3,&local_3c9);
    cmCommonTargetGenerator::Convert
              (&local_3a8,&this->super_cmCommonTargetGenerator,&local_3c8,FULL,SHELL);
    poVar4 = std::operator<<(poVar4,(string *)&local_3a8);
    poVar4 = std::operator<<(poVar4," ");
    pcVar3 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this->LocalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_410,pcVar3,&local_411);
    cmCommonTargetGenerator::Convert
              (&local_3f0,&this->super_cmCommonTargetGenerator,&local_410,FULL,SHELL);
    poVar4 = std::operator<<(poVar4,(string *)&local_3f0);
    poVar4 = std::operator<<(poVar4," ");
    pcVar3 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this->LocalGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_458,pcVar3,&local_459);
    cmCommonTargetGenerator::Convert
              (&local_438,&this->super_cmCommonTargetGenerator,&local_458,FULL,SHELL);
    poVar4 = std::operator<<(poVar4,(string *)&local_438);
    poVar4 = std::operator<<(poVar4," ");
    cmCommonTargetGenerator::Convert
              (&local_480,&this->super_cmCommonTargetGenerator,&this->InfoFileNameFull,FULL,SHELL);
    std::operator<<(poVar4,(string *)&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator((allocator<char> *)&local_411);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator((allocator<char> *)&local_381);
    std::__cxx11::string::~string(local_340);
    bVar2 = cmLocalUnixMakefileGenerator3::GetColorMakefile(this->LocalGenerator);
    if (bVar2) {
      std::operator<<((ostream *)local_2d8," --color=$(COLOR)");
    }
    std::__cxx11::ostringstream::str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&depTarget.field_2 + 8),&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    if (this->CustomCommandDriver == OnDepends) {
      DriveCustomCommands(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&commands.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this->LocalGenerator,(ostream *)this->BuildFileStream,(char *)0x0,(string *)local_160
               ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&depTarget.field_2 + 8),true,false);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
    std::__cxx11::string::~string((string *)local_160);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&depTarget.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pi._M_node._4_4_ = 0;
  }
  else {
    pi._M_node._4_4_ = 1;
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetDependRules()
{
  // must write the targets depend info file
  std::string dir =
      this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  this->InfoFileNameFull = dir;
  this->InfoFileNameFull += "/DependInfo.cmake";
  this->InfoFileNameFull =
    this->LocalGenerator->ConvertToFullPath(this->InfoFileNameFull);
  this->InfoFileStream =
    new cmGeneratedFileStream(this->InfoFileNameFull.c_str());
  this->InfoFileStream->SetCopyIfDifferent(true);
  if(!*this->InfoFileStream)
    {
    return;
    }
  this->LocalGenerator->
    WriteDependLanguageInfo(*this->InfoFileStream, this->GeneratorTarget);

  // Store multiple output pairs in the depend info file.
  if(!this->MultipleOutputPairs.empty())
    {
    *this->InfoFileStream
      << "\n"
      << "# Pairs of files generated by the same build rule.\n"
      << "set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n";
    for(MultipleOutputPairsType::const_iterator pi =
          this->MultipleOutputPairs.begin();
        pi != this->MultipleOutputPairs.end(); ++pi)
      {
      *this->InfoFileStream
        << "  " << cmOutputConverter::EscapeForCMake(pi->first)
        << " "  << cmOutputConverter::EscapeForCMake(pi->second)
        << "\n";
      }
    *this->InfoFileStream << "  )\n\n";
    }

  // Store list of targets linked directly or transitively.
  {
  *this->InfoFileStream
    << "\n"
    << "# Targets to which this target links.\n"
    << "set(CMAKE_TARGET_LINKED_INFO_FILES\n";
  std::vector<std::string> dirs = this->GetLinkedTargetDirectories();
  for (std::vector<std::string>::iterator i = dirs.begin();
       i != dirs.end(); ++i)
    {
    *this->InfoFileStream << "  \"" << *i << "/DependInfo.cmake\"\n";
    }
  *this->InfoFileStream
    << "  )\n";
  }

  *this->InfoFileStream
    << "\n"
    << "# Fortran module output directory.\n"
    << "set(CMAKE_Fortran_TARGET_MODULE_DIR \""
    << this->GetFortranModuleDirectory() << "\")\n";

  // and now write the rule to use it
  std::vector<std::string> depends;
  std::vector<std::string> commands;

  // Construct the name of the dependency generation target.
  std::string depTarget =
    this->LocalGenerator->GetRelativeTargetDirectory(this->GeneratorTarget);
  depTarget += "/depend";

  // Add a command to call CMake to scan dependencies.  CMake will
  // touch the corresponding depends file after scanning dependencies.
  std::ostringstream depCmd;
  // TODO: Account for source file properties and directory-level
  // definitions when scanning for dependencies.
#if !defined(_WIN32) || defined(__CYGWIN__)
  // This platform supports symlinks, so cmSystemTools will translate
  // paths.  Make sure PWD is set to the original name of the home
  // output directory to help cmSystemTools to create the same
  // translation table for the dependency scanning process.
  depCmd << "cd "
         << (this->LocalGenerator->Convert(
               this->LocalGenerator->GetBinaryDirectory(),
               cmLocalGenerator::FULL, cmLocalGenerator::SHELL))
         << " && ";
#endif
  // Generate a call this signature:
  //
  //   cmake -E cmake_depends <generator>
  //                          <home-src-dir> <start-src-dir>
  //                          <home-out-dir> <start-out-dir>
  //                          <dep-info> --color=$(COLOR)
  //
  // This gives the dependency scanner enough information to recreate
  // the state of our local generator sufficiently for its needs.
  depCmd << "$(CMAKE_COMMAND) -E cmake_depends \""
         << this->GlobalGenerator->GetName() << "\" "
         << this->Convert(this->LocalGenerator->GetSourceDirectory(),
                          cmLocalGenerator::FULL, cmLocalGenerator::SHELL)
         << " "
         << this->Convert(this->LocalGenerator->GetCurrentSourceDirectory(),
                          cmLocalGenerator::FULL, cmLocalGenerator::SHELL)
         << " "
         << this->Convert(this->LocalGenerator->GetBinaryDirectory(),
                          cmLocalGenerator::FULL, cmLocalGenerator::SHELL)
         << " "
         << this->Convert(this->LocalGenerator->GetCurrentBinaryDirectory(),
                          cmLocalGenerator::FULL, cmLocalGenerator::SHELL)
         << " "
         << this->Convert(this->InfoFileNameFull,
                          cmLocalGenerator::FULL, cmLocalGenerator::SHELL);
  if(this->LocalGenerator->GetColorMakefile())
    {
    depCmd << " --color=$(COLOR)";
    }
  commands.push_back(depCmd.str());

  // Make sure all custom command outputs in this target are built.
  if(this->CustomCommandDriver == OnDepends)
    {
    this->DriveCustomCommands(depends);
    }

  // Write the rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, 0,
                                      depTarget,
                                      depends, commands, true);
}